

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O0

void __thiscall geometrycentral::DisjointSets::merge(DisjointSets *this,size_t x,size_t y)

{
  ulong uVar1;
  value_type vVar2;
  size_t __n;
  size_t __n_00;
  reference pvVar3;
  long in_RDI;
  size_t in_stack_ffffffffffffffc8;
  size_t sVar4;
  DisjointSets *in_stack_ffffffffffffffd0;
  
  __n = find(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __n_00 = find(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),__n);
  uVar1 = *pvVar3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      __n_00);
  if (*pvVar3 < uVar1) {
    sVar4 = __n;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),__n_00
                       );
    *pvVar3 = sVar4;
  }
  else {
    sVar4 = __n_00;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),__n);
    *pvVar3 = sVar4;
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),__n);
  vVar2 = *pvVar3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      __n_00);
  if (vVar2 == *pvVar3) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                        __n_00);
    *pvVar3 = *pvVar3 + 1;
  }
  return;
}

Assistant:

void DisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;
}